

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

void xmlFreeRMutex(xmlRMutexPtr tok)

{
  if (tok != (xmlRMutexPtr)0x0) {
    if (libxml_is_threaded != 0) {
      pthread_mutex_destroy((pthread_mutex_t *)tok);
      pthread_cond_destroy((pthread_cond_t *)&tok->cv);
    }
    free(tok);
    return;
  }
  return;
}

Assistant:

void
xmlFreeRMutex(xmlRMutexPtr tok ATTRIBUTE_UNUSED)
{
    if (tok == NULL)
        return;
#ifdef HAVE_POSIX_THREADS
    if (libxml_is_threaded != 0) {
        pthread_mutex_destroy(&tok->lock);
        pthread_cond_destroy(&tok->cv);
    }
#elif defined HAVE_WIN32_THREADS
    DeleteCriticalSection(&tok->cs);
#endif
    free(tok);
}